

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall
kj::_::ImmediateBrokenPromiseNode::ImmediateBrokenPromiseNode
          (ImmediateBrokenPromiseNode *this,Exception *exception)

{
  int iVar1;
  Type TVar2;
  
  (this->super_ImmediatePromiseNodeBase).super_PromiseNode._vptr_PromiseNode =
       (_func_int **)&PTR_onReady_00465838;
  (this->exception).ownFile.content.ptr = (exception->ownFile).content.ptr;
  (this->exception).ownFile.content.size_ = (exception->ownFile).content.size_;
  (this->exception).ownFile.content.disposer = (exception->ownFile).content.disposer;
  (exception->ownFile).content.ptr = (char *)0x0;
  (exception->ownFile).content.size_ = 0;
  iVar1 = exception->line;
  TVar2 = exception->type;
  (this->exception).file = exception->file;
  (this->exception).line = iVar1;
  (this->exception).type = TVar2;
  (this->exception).description.content.ptr = (exception->description).content.ptr;
  (this->exception).description.content.size_ = (exception->description).content.size_;
  (this->exception).description.content.disposer = (exception->description).content.disposer;
  (exception->description).content.ptr = (char *)0x0;
  (exception->description).content.size_ = 0;
  (this->exception).context.ptr.disposer = (exception->context).ptr.disposer;
  (this->exception).context.ptr.ptr = (exception->context).ptr.ptr;
  (exception->context).ptr.ptr = (Context *)0x0;
  memcpy((this->exception).trace,exception->trace,0x104);
  return;
}

Assistant:

ImmediateBrokenPromiseNode::ImmediateBrokenPromiseNode(Exception&& exception)
    : exception(kj::mv(exception)) {}